

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

void do_cntp(DisasContext_conflict1 *s,TCGv_i64 val,int esz,int pn,int pg)

{
  TCGv_i64 a1;
  uintptr_t o;
  TCGTemp *pTVar1;
  TCGTemp *ts;
  TCGv_i32 pTVar2;
  undefined4 in_register_00000014;
  TCGv_i64 ret;
  int in_R9D;
  uint uVar3;
  byte bVar4;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  ret = (TCGv_i64)CONCAT44(in_register_00000014,esz);
  uVar3 = (int)s >> 3;
  if (uVar3 < 9) {
    a1 = val + (long)ret;
    tcg_gen_op3_aarch64((TCGContext_conflict1 *)val,INDEX_op_ld_i64,(TCGArg)a1,
                        (TCGArg)(val + *(long *)(val + 0xa8f0)),(long)(pg * 0x20 + 0x2c10));
    if (pg != in_R9D) {
      pTVar1 = tcg_temp_new_internal_aarch64((TCGContext_conflict1 *)val,TCG_TYPE_I64,false);
      tcg_gen_op3_aarch64((TCGContext_conflict1 *)val,INDEX_op_ld_i64,(TCGArg)pTVar1,
                          (TCGArg)(val + *(long *)(val + 0xa8f0)),(long)(in_R9D * 0x20 + 0x2c10));
      tcg_gen_op3_aarch64((TCGContext_conflict1 *)val,INDEX_op_and_i64,(TCGArg)a1,(TCGArg)a1,
                          (TCGArg)pTVar1);
      tcg_temp_free_internal_aarch64((TCGContext_conflict1 *)val,pTVar1);
    }
    bVar4 = -((byte)s & 0xf8);
    tcg_gen_andi_i64_aarch64
              ((TCGContext_conflict1 *)val,ret,ret,
               (pred_esz_masks_aarch64[pn] << (bVar4 & 0x3f)) >> (bVar4 & 0x3f));
    tcg_gen_ctpop_i64_aarch64((TCGContext_conflict1 *)val,ret,ret);
    return;
  }
  pTVar1 = tcg_temp_new_internal_aarch64((TCGContext_conflict1 *)val,TCG_TYPE_I64,false);
  ts = tcg_temp_new_internal_aarch64((TCGContext_conflict1 *)val,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_aarch64
            ((TCGContext_conflict1 *)val,(TCGv_i64)((long)pTVar1 - (long)val),
             *(TCGv_i64 *)(val + 0xa8f0),(long)(pg * 0x20 + 0x2c10));
  tcg_gen_addi_i64_aarch64
            ((TCGContext_conflict1 *)val,(TCGv_i64)((long)ts - (long)val),
             *(TCGv_i64 *)(val + 0xa8f0),(long)(in_R9D * 0x20 + 0x2c10));
  pTVar2 = tcg_const_i32_aarch64
                     ((TCGContext_conflict1 *)val,(pn & 3U) << 10 | uVar3 - 2 & 0xfffff3ff);
  local_48 = pTVar1;
  local_40 = ts;
  local_38 = (TCGTemp *)(pTVar2 + (long)val);
  tcg_gen_callN_aarch64
            ((TCGContext_conflict1 *)val,helper_sve_cntp_aarch64,(TCGTemp *)(ret + (long)val),3,
             &local_48);
  tcg_temp_free_internal_aarch64((TCGContext_conflict1 *)val,pTVar1);
  tcg_temp_free_internal_aarch64((TCGContext_conflict1 *)val,ts);
  tcg_temp_free_internal_aarch64((TCGContext_conflict1 *)val,(TCGTemp *)(pTVar2 + (long)val));
  return;
}

Assistant:

static void do_cntp(DisasContext *s, TCGv_i64 val, int esz, int pn, int pg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned psz = pred_full_reg_size(s);

    if (psz <= 8) {
        uint64_t psz_mask;

        tcg_gen_ld_i64(tcg_ctx, val, tcg_ctx->cpu_env, pred_full_reg_offset(s, pn));
        if (pn != pg) {
            TCGv_i64 g = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_ld_i64(tcg_ctx, g, tcg_ctx->cpu_env, pred_full_reg_offset(s, pg));
            tcg_gen_and_i64(tcg_ctx, val, val, g);
            tcg_temp_free_i64(tcg_ctx, g);
        }

        /* Reduce the pred_esz_masks value simply to reduce the
         * size of the code generated here.
         */
        psz_mask = MAKE_64BIT_MASK(0, psz * 8);
        tcg_gen_andi_i64(tcg_ctx, val, val, pred_esz_masks[esz] & psz_mask);

        tcg_gen_ctpop_i64(tcg_ctx, val, val);
    } else {
        TCGv_ptr t_pn = tcg_temp_new_ptr(tcg_ctx);
        TCGv_ptr t_pg = tcg_temp_new_ptr(tcg_ctx);
        unsigned desc;
        TCGv_i32 t_desc;

        desc = psz - 2;
        desc = deposit32(desc, SIMD_DATA_SHIFT, 2, esz);

        tcg_gen_addi_ptr(tcg_ctx, t_pn, tcg_ctx->cpu_env, pred_full_reg_offset(s, pn));
        tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, pg));
        t_desc = tcg_const_i32(tcg_ctx, desc);

        gen_helper_sve_cntp(tcg_ctx, val, t_pn, t_pg, t_desc);
        tcg_temp_free_ptr(tcg_ctx, t_pn);
        tcg_temp_free_ptr(tcg_ctx, t_pg);
        tcg_temp_free_i32(tcg_ctx, t_desc);
    }
}